

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

AF_Direction af_direction_compute(FT_Pos dx,FT_Pos dy)

{
  undefined8 local_40;
  undefined4 local_2c;
  FT_Pos FStack_28;
  AF_Direction dir;
  FT_Pos ss;
  FT_Pos ll;
  FT_Pos dy_local;
  FT_Pos dx_local;
  
  FStack_28 = dx;
  if (dy < dx) {
    if (dy < -dx) {
      local_2c = AF_DIR_DOWN;
      ss = -dy;
    }
    else {
      local_2c = AF_DIR_RIGHT;
      FStack_28 = dy;
      ss = dx;
    }
  }
  else if (dy < -dx) {
    local_2c = AF_DIR_LEFT;
    ss = -dx;
    FStack_28 = dy;
  }
  else {
    local_2c = AF_DIR_UP;
    ss = dy;
  }
  if (FStack_28 < 0) {
    local_40 = -FStack_28;
  }
  else {
    local_40 = FStack_28;
  }
  if (ss == local_40 * 0xe || SBORROW8(ss,local_40 * 0xe) != ss + local_40 * -0xe < 0) {
    local_2c = AF_DIR_NONE;
  }
  return local_2c;
}

Assistant:

FT_LOCAL_DEF( AF_Direction )
  af_direction_compute( FT_Pos  dx,
                        FT_Pos  dy )
  {
    FT_Pos        ll, ss;  /* long and short arm lengths */
    AF_Direction  dir;     /* candidate direction        */


    if ( dy >= dx )
    {
      if ( dy >= -dx )
      {
        dir = AF_DIR_UP;
        ll  = dy;
        ss  = dx;
      }
      else
      {
        dir = AF_DIR_LEFT;
        ll  = -dx;
        ss  = dy;
      }
    }
    else /* dy < dx */
    {
      if ( dy >= -dx )
      {
        dir = AF_DIR_RIGHT;
        ll  = dx;
        ss  = dy;
      }
      else
      {
        dir = AF_DIR_DOWN;
        ll  = -dy;
        ss  = dx;
      }
    }

    /* return no direction if arm lengths do not differ enough       */
    /* (value 14 is heuristic, corresponding to approx. 4.1 degrees) */
    /* the long arm is never negative                                */
    if ( ll <= 14 * FT_ABS( ss ) )
      dir = AF_DIR_NONE;

    return dir;
  }